

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
::
nosize_unchecked_emplace_at<std::pair<slang::BufferID&&,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<slang::BufferID_&&,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_&&>
          *args)

{
  group_type_pointer pgVar1;
  undefined8 *puVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
  *pvVar5;
  uint uVar6;
  ushort uVar7;
  pointer pDVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pgVar3 = arrays_->groups_;
  lVar9 = pos0 * 0x10;
  pgVar1 = pgVar3 + pos0;
  auVar13[0] = -(pgVar1->m[0].n == '\0');
  auVar13[1] = -(pgVar1->m[1].n == '\0');
  auVar13[2] = -(pgVar1->m[2].n == '\0');
  auVar13[3] = -(pgVar1->m[3].n == '\0');
  auVar13[4] = -(pgVar1->m[4].n == '\0');
  auVar13[5] = -(pgVar1->m[5].n == '\0');
  auVar13[6] = -(pgVar1->m[6].n == '\0');
  auVar13[7] = -(pgVar1->m[7].n == '\0');
  auVar13[8] = -(pgVar1->m[8].n == '\0');
  auVar13[9] = -(pgVar1->m[9].n == '\0');
  auVar13[10] = -(pgVar1->m[10].n == '\0');
  auVar13[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar13[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar13[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar13[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar13[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar12 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
  if (uVar12 == 0) {
    uVar10 = arrays_->groups_size_mask;
    lVar11 = 1;
    do {
      pgVar3[pos0].m[0xf].n = pgVar3[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar11 & uVar10;
      lVar9 = pos0 * 0x10;
      pgVar1 = pgVar3 + pos0;
      auVar14[0] = -(pgVar1->m[0].n == '\0');
      auVar14[1] = -(pgVar1->m[1].n == '\0');
      auVar14[2] = -(pgVar1->m[2].n == '\0');
      auVar14[3] = -(pgVar1->m[3].n == '\0');
      auVar14[4] = -(pgVar1->m[4].n == '\0');
      auVar14[5] = -(pgVar1->m[5].n == '\0');
      auVar14[6] = -(pgVar1->m[6].n == '\0');
      auVar14[7] = -(pgVar1->m[7].n == '\0');
      auVar14[8] = -(pgVar1->m[8].n == '\0');
      auVar14[9] = -(pgVar1->m[9].n == '\0');
      auVar14[10] = -(pgVar1->m[10].n == '\0');
      auVar14[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar14[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar14[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar14[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar14[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar7 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe;
      uVar12 = (uint)uVar7;
      lVar11 = lVar11 + 1;
    } while (uVar7 == 0);
  }
  uVar6 = 0;
  if (uVar12 != 0) {
    for (; (uVar12 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
    }
  }
  ppVar4 = arrays_->elements_;
  uVar10 = (ulong)(uVar6 << 5);
  *(uint32_t *)((long)&ppVar4[pos0 * 0xf].first.id + uVar10) = args->first->id;
  pvVar5 = args->second;
  pDVar8 = (pvVar5->
           super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (undefined8 *)
           ((long)&ppVar4[pos0 * 0xf].second.
                   super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar10);
  *puVar2 = (pvVar5->
            super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar2[1] = pDVar8;
  *(pointer *)
   ((long)&ppVar4[pos0 * 0xf].second.
           super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar10) =
       (pvVar5->
       super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pvVar5->
  super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar5->
  super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar5->
  super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pgVar3->m + lVar9)[uVar6].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar3->m + lVar9);
  __return_storage_ptr__->n = uVar6;
  __return_storage_ptr__->p =
       (pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
        *)((long)&ppVar4[pos0 * 0xf].first.id + uVar10);
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }